

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O0

SpanContext * __thiscall
jaegertracing::propagation::BinaryPropagator::extract
          (SpanContext *__return_storage_ptr__,BinaryPropagator *this,istream *in)

{
  uchar flags_00;
  byte bVar1;
  type_conflict2 tVar2;
  type_conflict2 parentID_00;
  ulong uVar3;
  long lVar4;
  long *plVar5;
  element_type *peVar6;
  Counter *pCVar7;
  mapped_type *this_00;
  bool bVar8;
  allocator local_121;
  string local_120;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [8];
  string value;
  type_conflict3 valueLength;
  undefined1 local_c8 [8];
  string key;
  uint local_a0;
  type_conflict3 keyLength;
  uint32_t i;
  undefined1 local_90 [8];
  StrMap baggage;
  type_conflict3 numBaggageItems;
  uchar flags;
  char ch;
  type_conflict2 parentID;
  type_conflict2 spanID;
  TraceID traceID;
  type_conflict2 traceIDLow;
  type_conflict2 traceIDHigh;
  istream *in_local;
  BinaryPropagator *this_local;
  SpanContext *ctx;
  
  tVar2 = readBinary<unsigned_long>(in);
  traceID._low = readBinary<unsigned_long>(in);
  TraceID::TraceID((TraceID *)&spanID,tVar2,traceID._low);
  tVar2 = readBinary<unsigned_long>(in);
  parentID_00 = readBinary<unsigned_long>(in);
  baggage._M_h._M_single_bucket._7_1_ = '\0';
  std::istream::get((char *)in);
  baggage._M_h._M_single_bucket._6_1_ = baggage._M_h._M_single_bucket._7_1_;
  baggage._M_h._M_single_bucket._0_4_ = readBinary<unsigned_int>(in);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_90);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::reserve((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_90,(ulong)(type_conflict3)baggage._M_h._M_single_bucket);
  for (local_a0 = 0; flags_00 = baggage._M_h._M_single_bucket._6_1_,
      local_a0 < (type_conflict3)baggage._M_h._M_single_bucket; local_a0 = local_a0 + 1) {
    key.field_2._12_4_ = readBinary<unsigned_int>(in);
    uVar3 = (ulong)(uint)key.field_2._12_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_c8,uVar3,'\0',(allocator *)((long)&valueLength + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&valueLength + 3));
    lVar4 = std::__cxx11::string::operator[]((ulong)local_c8);
    plVar5 = (long *)std::istream::read((char *)in,lVar4);
    bVar1 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    if ((bVar1 & 1) == 0) {
      value.field_2._12_4_ = readBinary<unsigned_int>(in);
      uVar3 = (ulong)(uint)value.field_2._12_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,uVar3,'\0',&local_f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      lVar4 = std::__cxx11::string::operator[]((ulong)local_f8);
      plVar5 = (long *)std::istream::read((char *)in,lVar4);
      bVar1 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      bVar8 = (bVar1 & 1) != 0;
      if (bVar8) {
        peVar6 = std::
                 __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_metrics);
        pCVar7 = metrics::Metrics::decodingErrors(peVar6);
        (*pCVar7->_vptr_Counter[2])(pCVar7,1);
        SpanContext::SpanContext(__return_storage_ptr__);
      }
      else {
        this_00 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_90,(key_type *)local_c8);
        std::__cxx11::string::operator=((string *)this_00,local_f8);
      }
      std::__cxx11::string::~string(local_f8);
    }
    else {
      peVar6 = std::
               __shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->_metrics);
      pCVar7 = metrics::Metrics::decodingErrors(peVar6);
      (*pCVar7->_vptr_Counter[2])(pCVar7,1);
      SpanContext::SpanContext(__return_storage_ptr__);
      bVar8 = true;
    }
    std::__cxx11::string::~string((string *)local_c8);
    if (bVar8) goto LAB_002f5b0c;
  }
  local_fa = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"",&local_121);
  SpanContext::SpanContext
            (__return_storage_ptr__,(TraceID *)&spanID,tVar2,parentID_00,flags_00,(StrMap *)local_90
             ,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  local_fa = 1;
LAB_002f5b0c:
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_90);
  return __return_storage_ptr__;
}

Assistant:

SpanContext extract(std::istream& in) const override
    {
        const auto traceIDHigh = readBinary<uint64_t>(in);
        const auto traceIDLow = readBinary<uint64_t>(in);
        TraceID traceID(traceIDHigh, traceIDLow);
        const auto spanID = readBinary<uint64_t>(in);
        const auto parentID = readBinary<uint64_t>(in);

        auto ch = '\0';
        in.get(ch);
        const auto flags = static_cast<unsigned char>(ch);

        const auto numBaggageItems = readBinary<uint32_t>(in);
        StrMap baggage;
        baggage.reserve(numBaggageItems);
        for (auto i = static_cast<uint32_t>(0); i < numBaggageItems; ++i) {
            const auto keyLength = readBinary<uint32_t>(in);
            std::string key(keyLength, '\0');
            if (!in.read(&key[0], keyLength)) {
                _metrics->decodingErrors().inc(1);
                return SpanContext();
            }

            const auto valueLength = readBinary<uint32_t>(in);
            std::string value(valueLength, '\0');
            if (!in.read(&value[0], valueLength)) {
                _metrics->decodingErrors().inc(1);
                return SpanContext();
            }

            baggage[key] = value;
        }

        SpanContext ctx(traceID, spanID, parentID, flags, baggage);
        return ctx;
    }